

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec_factory.h
# Opt level: O0

Encoder * __thiscall
libaom_test::AV1CodecFactory::CreateEncoder
          (AV1CodecFactory *this,aom_codec_enc_cfg_t cfg,aom_codec_flags_t init_flags,
          TwopassStatsStore *stats)

{
  aom_codec_enc_cfg_t cfg_00;
  long lVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *puVar2;
  undefined8 in_RDI;
  undefined8 *puVar3;
  byte bVar4;
  undefined1 in_stack_00000000 [856];
  undefined8 auStackY_768 [114];
  undefined1 *local_3d8;
  Encoder *local_3d0;
  undefined8 *local_3c8;
  Encoder *local_3b8;
  undefined8 local_3a0 [106];
  TwopassStatsStore *in_stack_ffffffffffffffb0;
  aom_codec_flags_t in_stack_ffffffffffffffb8;
  AV1Encoder *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd0 [24];
  
  bVar4 = 0;
  local_3d8 = &stack0x00000008;
  local_3d0 = (Encoder *)operator_new(0x3d8);
  local_3c8 = local_3a0;
  local_3b8 = local_3d0;
  memcpy(local_3c8,local_3d8,0x388);
  puVar2 = local_3c8;
  puVar3 = auStackY_768;
  for (lVar1 = 0x71; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  cfg_00.g_forced_max_frame_width = (int)in_RDX;
  cfg_00.g_forced_max_frame_height = (int)((ulong)in_RDX >> 0x20);
  cfg_00.g_usage = in_stack_ffffffffffffffd0._0_4_;
  cfg_00.g_threads = in_stack_ffffffffffffffd0._4_4_;
  cfg_00.g_profile = in_stack_ffffffffffffffd0._8_4_;
  cfg_00.g_w = in_stack_ffffffffffffffd0._12_4_;
  cfg_00.g_h = in_stack_ffffffffffffffd0._16_4_;
  cfg_00.g_limit = in_stack_ffffffffffffffd0._20_4_;
  cfg_00.g_bit_depth = (int)in_RSI;
  cfg_00.g_input_bit_depth = (int)((ulong)in_RSI >> 0x20);
  cfg_00.g_timebase.num = (int)in_RDI;
  cfg_00.g_timebase.den = (int)((ulong)in_RDI >> 0x20);
  cfg_00._48_856_ = in_stack_00000000;
  AV1Encoder::AV1Encoder
            (in_stack_ffffffffffffffc0,cfg_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return local_3d0;
}

Assistant:

Encoder *CreateEncoder(aom_codec_enc_cfg_t cfg,
                         const aom_codec_flags_t init_flags,
                         TwopassStatsStore *stats) const override {
#if CONFIG_AV1_ENCODER
    return new AV1Encoder(cfg, init_flags, stats);
#else
    (void)cfg;
    (void)init_flags;
    (void)stats;
    return nullptr;
#endif
  }